

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

trex * __thiscall
fmp4_stream::init_fragment::get_trex(trex *__return_storage_ptr__,init_fragment *this)

{
  uchar *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  bool bVar5;
  trex *t;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  uint local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  uint32_t pos;
  bool trex_found;
  bool mvex_found;
  bool trak_found;
  char *ptr;
  init_fragment *this_local;
  
  ptr = (char *)this;
  _pos = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   (&(this->moov_box_).box_data_);
  local_19 = 0;
  local_1a = 0;
  local_1b = 0;
  local_20 = 8;
  while( true ) {
    bVar5 = false;
    if ((local_19 & 1) == 0) {
      uVar3 = (ulong)local_20;
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->moov_box_).box_data_);
      bVar5 = uVar3 < sVar4;
    }
    if (!bVar5) break;
    puVar1 = _pos + (ulong)local_20 + 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"trak",&local_41);
    bVar5 = f_compare_4cc((char *)puVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar5) {
      local_19 = 1;
    }
    else {
      uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + local_20));
      local_20 = uVar2 + local_20;
    }
  }
  if ((local_19 & 1) != 0) {
    local_20 = local_20 + 8;
    while( true ) {
      bVar5 = false;
      if ((local_1a & 1) == 0) {
        uVar3 = (ulong)local_20;
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&(this->moov_box_).box_data_);
        bVar5 = uVar3 < sVar4;
      }
      if (!bVar5) break;
      puVar1 = _pos + (ulong)local_20 + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"mvex",&local_79);
      bVar5 = f_compare_4cc((char *)puVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      if (bVar5) {
        local_1a = 1;
      }
      else {
        uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + local_20));
        local_20 = uVar2 + local_20;
      }
    }
  }
  if ((local_1a & 1) != 0) {
    local_20 = local_20 + 8;
    while( true ) {
      bVar5 = false;
      if ((local_1b & 1) == 0) {
        uVar3 = (ulong)local_20;
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&(this->moov_box_).box_data_);
        bVar5 = uVar3 < sVar4;
      }
      if (!bVar5) break;
      puVar1 = _pos + (ulong)local_20 + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"trex",&local_a1);
      bVar5 = f_compare_4cc((char *)puVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      if (bVar5) {
        local_1b = 1;
      }
      else {
        uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + local_20));
        local_20 = uVar2 + local_20;
      }
    }
  }
  if ((local_1b & 1) == 0) {
    memset(__return_storage_ptr__,0,0x14);
  }
  else {
    memset(__return_storage_ptr__,0,0x14);
    uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + (ulong)local_20 + 0xc));
    __return_storage_ptr__->track_id_ = uVar2;
    uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + (ulong)local_20 + 0x10));
    __return_storage_ptr__->default_sample_description_index_ = uVar2;
    uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + (ulong)local_20 + 0x14));
    __return_storage_ptr__->default_sample_duration_ = uVar2;
    uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + (ulong)local_20 + 0x18));
    __return_storage_ptr__->default_sample_size_ = uVar2;
    uVar2 = anon_unknown.dwarf_23239::fmp4_read_uint32((char *)(_pos + (ulong)local_20 + 0x1c));
    __return_storage_ptr__->default_sample_flags_ = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

trex init_fragment::get_trex()
	{
		char* ptr = (char*)moov_box_.box_data_.data();
		bool trak_found = false;
		bool mvex_found = false;
		bool trex_found = false;


		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while (!mvex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mvex"))
					mvex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mvex_found)
		{
			pos += 8;
			while (!trex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "trex"))
					trex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (trex_found)
		{
			trex t = {}; 
			// uint32_t track_id_;
			// uint32_t default_sample_description_index_;
			// uint32_t default_sample_duration_;
			// uint32_t default_sample_size_;
			// uint32_t default_sample_flags_;
			t.track_id_ = fmp4_read_uint32(ptr + pos + 12);
			t.default_sample_description_index_ = fmp4_read_uint32(ptr + pos + 16);
			t.default_sample_duration_ = fmp4_read_uint32(ptr + pos + 20);
			t.default_sample_size_ = fmp4_read_uint32(ptr + pos + 24);
			t.default_sample_flags_ = fmp4_read_uint32(ptr + pos + 28);
			
			return t;
		}
		trex t = {};
		
		return t;

	}